

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Receiver_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Receiver_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Receiver_PDU *local_18;
  Receiver_PDU *this_local;
  
  local_18 = this;
  this_local = (Receiver_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Receiver PDU-\n");
  Radio_Communications_Header::GetAsString_abi_cxx11_
            (&local_1f0,&this->super_Radio_Communications_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Receiver State: ");
  DATA_TYPE::ENUMS::GetEnumAsStringTransmitState_abi_cxx11_
            (&local_210,
             (ENUMS *)(ulong)*(ushort *)&(this->super_Radio_Communications_Header).field_0x3a,Value)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Receiver Power: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32RecPwr);
  poVar1 = std::operator<<(poVar1,"\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_TransmitterEntityID);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"Transmitter Radio ID: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16TransmitterRadioID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Receiver_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Receiver PDU-\n"
       << Radio_Communications_Header::GetAsString()
       << "Receiver State: " << GetEnumAsStringTransmitState( m_ui16ReceiverState ) << "\n"
       << "Receiver Power: " << m_f32RecPwr << "\n"
       << m_TransmitterEntityID.GetAsString()
       << "Transmitter Radio ID: " << m_ui16TransmitterRadioID << "\n";

    return ss.str();
}